

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_mime_parser_on_partial_end(http_mime_parser_s *parser)

{
  FIOBJ local_30;
  FIOBJ o;
  fio_str_info_s tmp;
  http_mime_parser_s *parser_local;
  
  tmp.data = (char *)parser;
  fiobj_obj2cstr((fio_str_info_s *)&o,parser[3].boundary_len);
  if (*(long *)(tmp.data + 0x48) != 0) {
    if (*(ulong *)(tmp.data + 0x48) < 0x2a) {
      local_30 = fiobj_str_new((char *)(*(long *)(tmp.data + 0x30) + *(long *)(tmp.data + 0x40)),
                               *(size_t *)(tmp.data + 0x48));
    }
    else {
      local_30 = fiobj_data_slice(*(FIOBJ *)(*(long *)(tmp.data + 0x18) + 0x70),
                                  *(intptr_t *)(tmp.data + 0x40),*(uintptr_t *)(tmp.data + 0x48));
    }
    http_add2hash2(*(FIOBJ *)(*(long *)(tmp.data + 0x18) + 0x68),(char *)tmp.len,tmp.capa,local_30,
                   '\0');
    fiobj_free(*(FIOBJ *)(tmp.data + 0x50));
    tmp.data[0x50] = '\0';
    tmp.data[0x51] = '\0';
    tmp.data[0x52] = '\0';
    tmp.data[0x53] = '\0';
    tmp.data[0x54] = '\0';
    tmp.data[0x55] = '\0';
    tmp.data[0x56] = '\0';
    tmp.data[0x57] = '\0';
    tmp.data[0x40] = '\0';
    tmp.data[0x41] = '\0';
    tmp.data[0x42] = '\0';
    tmp.data[0x43] = '\0';
    tmp.data[0x44] = '\0';
    tmp.data[0x45] = '\0';
    tmp.data[0x46] = '\0';
    tmp.data[0x47] = '\0';
  }
  return;
}

Assistant:

static void http_mime_parser_on_partial_end(http_mime_parser_s *parser) {

  fio_str_info_s tmp =
      fiobj_obj2cstr(http_mime_parser2fio(parser)->partial_name);
  FIOBJ o = FIOBJ_INVALID;
  if (!http_mime_parser2fio(parser)->partial_length)
    return;
  if (http_mime_parser2fio(parser)->partial_length < 42) {
    /* short data gets a new object */
    o = fiobj_str_new(http_mime_parser2fio(parser)->buffer.data +
                          http_mime_parser2fio(parser)->partial_offset,
                      http_mime_parser2fio(parser)->partial_length);
  } else {
    /* longer data gets a reference object (memory collision concerns) */
    o = fiobj_data_slice(http_mime_parser2fio(parser)->h->body,
                         http_mime_parser2fio(parser)->partial_offset,
                         http_mime_parser2fio(parser)->partial_length);
  }
  http_add2hash2(http_mime_parser2fio(parser)->h->params, tmp.data, tmp.len, o,
                 0);
  fiobj_free(http_mime_parser2fio(parser)->partial_name);
  http_mime_parser2fio(parser)->partial_name = FIOBJ_INVALID;
  http_mime_parser2fio(parser)->partial_offset = 0;
}